

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

ssize_t __thiscall
fmt::v7::detail::
arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
::write(arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        *this,int __fd,void *__buf,size_t __n)

{
  void *__buf_00;
  ssize_t extraout_RAX;
  ssize_t sVar1;
  format_error *this_00;
  undefined4 in_register_00000034;
  basic_string_view<char> s;
  
  s.data_ = (char *)CONCAT44(in_register_00000034,__fd);
  if (s.data_ == (char *)0x0) {
    this_00 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this_00,"string pointer is null");
    __cxa_throw(this_00,&format_error::typeinfo,format_error::~format_error);
  }
  __buf_00 = (void *)strlen(s.data_);
  if (this->specs_ != (format_specs *)0x0) {
    s.size_ = (size_t)__buf_00;
    write<char>(this,s,this->specs_);
    return extraout_RAX;
  }
  sVar1 = write(this,__fd,__buf_00,0);
  return sVar1;
}

Assistant:

void write(const Char* value) {
    if (!value) {
      FMT_THROW(format_error("string pointer is null"));
    } else {
      auto length = std::char_traits<char_type>::length(value);
      basic_string_view<char_type> sv(value, length);
      specs_ ? write(sv, *specs_) : write(sv);
    }
  }